

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<std::complex<double>_>::SolveEigensystemJacobi
          (TPZMatrix<std::complex<double>_> *this,int64_t *numiterations,REAL *tol,
          TPZVec<std::complex<double>_> *Eigenvalues,TPZFMatrix<std::complex<double>_> *Eigenvectors
          )

{
  double dVar1;
  complex<double> tol_00;
  complex<double> val_00;
  int iVar2;
  complex<double> *pcVar3;
  complex<double> *pcVar4;
  TPZVec<std::complex<double>_> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  long *in_R8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined8 in_XMM1_Qa;
  undefined8 uVar5;
  undefined8 uVar6;
  complex<double> val;
  int64_t i_9;
  complex<double> exp_1;
  int64_t i_8;
  int64_t i_7;
  REAL norm2;
  int64_t i_6;
  double difTemp;
  double dif;
  int64_t count;
  int64_t i_5;
  int64_t i_4;
  REAL norm1;
  int64_t i_3;
  int64_t i_2;
  complex<double> exp;
  complex<double> answ;
  TPZFNMatrix<9,_std::complex<double>_> Matrix_1;
  int64_t i_1;
  int64_t eigen;
  TPZFNMatrix<3,_std::complex<double>_> VecIni_cp;
  TPZFNMatrix<3,_std::complex<double>_> VecIni;
  bool result;
  int64_t j;
  int64_t i;
  TPZFNMatrix<9,_std::complex<double>_> Matrix;
  int64_t size;
  REAL tolerance;
  int64_t NumIt;
  TPZVec<std::complex<double>_> *in_stack_fffffffffffff638;
  REAL *in_stack_fffffffffffff640;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffff648;
  TPZMatrix<std::complex<double>_> *in_stack_fffffffffffff650;
  int64_t in_stack_fffffffffffff658;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffff660;
  int64_t in_stack_fffffffffffff670;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffff678;
  TPZFNMatrix<9,_std::complex<double>_> *in_stack_fffffffffffff680;
  complex<double> *in_stack_fffffffffffff688;
  int64_t in_stack_fffffffffffff690;
  int64_t in_stack_fffffffffffff698;
  TPZFNMatrix<3,_std::complex<double>_> *in_stack_fffffffffffff6a0;
  TPZMatrix<std::complex<double>_> *in_stack_fffffffffffff6d8;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffff6e0;
  TPZVec<std::complex<double>_> *in_stack_fffffffffffff730;
  complex<double> *in_stack_fffffffffffff738;
  undefined8 in_stack_fffffffffffff740;
  undefined8 in_stack_fffffffffffff748;
  undefined8 in_stack_fffffffffffff750;
  _func_int **local_798;
  complex<double> *pcStack_790;
  long local_780;
  complex<double> local_730;
  undefined8 local_720;
  undefined8 uStack_718;
  long local_710;
  double local_708;
  undefined8 uStack_700;
  _func_int **local_6f8;
  int64_t iStack_6f0;
  long local_6e0;
  double local_6d8;
  long local_6d0;
  double local_6c8;
  double local_6c0;
  long local_6b8;
  complex<double> local_6b0;
  undefined8 local_6a0;
  undefined8 local_698;
  long local_690;
  double local_688;
  undefined8 uStack_680;
  double local_678;
  undefined8 uStack_670;
  long local_660;
  double local_658;
  complex<double> local_650;
  undefined8 local_638;
  undefined8 local_628;
  long local_610;
  double local_608;
  undefined8 uStack_600;
  complex<double> local_5f0;
  undefined8 local_5d8;
  undefined8 local_5c8;
  long local_5b0;
  double local_598;
  undefined8 uStack_590;
  complex<double> local_588;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_558;
  complex<double> local_390;
  long local_380;
  long local_378;
  complex<double> local_370 [14];
  complex<double> local_290 [14];
  undefined4 local_1ac;
  undefined1 local_1a5;
  undefined8 local_198;
  undefined8 local_190;
  long local_188;
  long local_180;
  int64_t local_48;
  double local_40;
  long local_38;
  long *local_30;
  TPZVec<std::complex<double>_> *local_28;
  byte local_1;
  
  local_38 = *in_RSI;
  local_40 = *in_RDX;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_48 = TPZBaseMatrix::Rows(in_RDI);
  TPZFNMatrix<9,_std::complex<double>_>::TPZFNMatrix
            (in_stack_fffffffffffff680,(int64_t)in_stack_fffffffffffff678,in_stack_fffffffffffff670)
  ;
  for (local_180 = 0; local_180 < local_48; local_180 = local_180 + 1) {
    for (local_188 = 0; local_188 < local_48; local_188 = local_188 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_180,local_188);
      uVar6 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_198 = uVar6;
      local_190 = in_XMM1_Qa;
      pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                         (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                          (int64_t)in_stack_fffffffffffff650);
      *(undefined8 *)pcVar3->_M_value = local_198;
      *(undefined8 *)(pcVar3->_M_value + 8) = local_190;
      in_XMM1_Qa = uVar6;
    }
  }
  local_1a5 = SolveEigenvaluesJacobi
                        (in_stack_fffffffffffff650,(int64_t *)in_stack_fffffffffffff648,
                         in_stack_fffffffffffff640,in_stack_fffffffffffff638);
  if ((bool)local_1a5) {
    std::complex<double>::complex(local_290,0.0,0.0);
    TPZFNMatrix<3,_std::complex<double>_>::TPZFNMatrix
              (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff690,
               in_stack_fffffffffffff688);
    std::complex<double>::complex(local_370,0.0,0.0);
    TPZFNMatrix<3,_std::complex<double>_>::TPZFNMatrix
              (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff690,
               in_stack_fffffffffffff688);
    (**(code **)(*local_30 + 0x68))(local_30,local_48);
    (**(code **)(*local_30 + 0x78))();
    for (local_378 = 0; local_378 < local_48; local_378 = local_378 + 1) {
      for (local_380 = 0; local_380 < local_48; local_380 = local_380 + 1) {
        iVar2 = rand();
        std::complex<double>::complex(&local_390,(double)iVar2,0.0);
        TPZFMatrix<std::complex<double>_>::PutVal
                  (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                   (int64_t)in_stack_fffffffffffff650,(complex<double> *)in_stack_fffffffffffff648);
      }
      TPZFMatrix<std::complex<double>_>::TPZFMatrix
                (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
      TPZFNMatrix<9,_std::complex<double>_>::TPZFNMatrix
                (in_stack_fffffffffffff680,in_stack_fffffffffffff678);
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x12b5f95)
      ;
      pcVar3 = TPZVec<std::complex<double>_>::operator[](local_28,local_378);
      local_578 = *(undefined8 *)pcVar3->_M_value;
      uStack_570 = *(undefined8 *)(pcVar3->_M_value + 8);
      std::complex<double>::complex(&local_588,1e-05,0.0);
      val_00._M_value._8_8_ = in_stack_fffffffffffff750;
      val_00._M_value._0_8_ = in_stack_fffffffffffff748;
      tol_00._M_value._8_8_ = in_stack_fffffffffffff740;
      tol_00._M_value._0_8_ = in_stack_fffffffffffff738;
      uVar5 = uStack_570;
      ReturnNearestValue(val_00,in_stack_fffffffffffff730,tol_00);
      uVar6 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      local_558 = uVar5;
      TPZVec<std::complex<double>_>::operator[](local_28,local_378);
      std::operator-((complex<double> *)in_stack_fffffffffffff638,(complex<double> *)0x12b608e);
      local_598 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      uStack_590 = uVar6;
      dVar1 = fabs(local_598);
      uVar6 = 0x3ee4f8b588e368f1;
      if (dVar1 <= 1e-05) {
        for (local_610 = 0; local_610 < local_48; local_610 = local_610 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_610);
          local_628 = uVar6;
          TPZVec<std::complex<double>_>::operator[](local_28,local_378);
          in_stack_fffffffffffff750 = 0;
          std::complex<double>::complex(&local_650,0.01,0.0);
          std::operator-((complex<double> *)in_stack_fffffffffffff638,(complex<double> *)0x12b641e);
          in_stack_fffffffffffff740 = CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
          local_638 = in_stack_fffffffffffff750;
          std::operator-((complex<double> *)in_stack_fffffffffffff638,(complex<double> *)0x12b646b);
          uVar6 = CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
          in_stack_fffffffffffff748 = uVar6;
          TPZFMatrix<std::complex<double>_>::PutVal
                    (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                     (int64_t)in_stack_fffffffffffff650,(complex<double> *)in_stack_fffffffffffff648
                    );
        }
      }
      else {
        for (local_5b0 = 0; local_5b0 < local_48; local_5b0 = local_5b0 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_5b0);
          local_5c8 = uVar6;
          TPZVec<std::complex<double>_>::operator[](local_28,local_378);
          local_608 = local_598;
          uStack_600 = uStack_590;
          dVar1 = fabs(local_598);
          uVar6 = 0;
          std::complex<double>::complex(&local_5f0,dVar1 * 0.01,0.0);
          std::operator-((complex<double> *)in_stack_fffffffffffff638,(complex<double> *)0x12b622c);
          local_5d8 = uVar6;
          std::operator-((complex<double> *)in_stack_fffffffffffff638,(complex<double> *)0x12b6279);
          uVar6 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
          TPZFMatrix<std::complex<double>_>::PutVal
                    (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                     (int64_t)in_stack_fffffffffffff650,(complex<double> *)in_stack_fffffffffffff648
                    );
        }
      }
      local_658 = 0.0;
      for (local_660 = 0; local_660 < local_48; local_660 = local_660 + 1) {
        in_stack_fffffffffffff738 =
             TPZFMatrix<std::complex<double>_>::operator()
                       (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                        (int64_t)in_stack_fffffffffffff650);
        local_678 = *(double *)in_stack_fffffffffffff738->_M_value;
        uStack_670 = *(undefined8 *)(in_stack_fffffffffffff738->_M_value + 8);
        in_stack_fffffffffffff730 = (TPZVec<std::complex<double>_> *)fabs(local_678);
        pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                           (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                            (int64_t)in_stack_fffffffffffff650);
        local_688 = *(double *)pcVar3->_M_value;
        uStack_680 = *(undefined8 *)(pcVar3->_M_value + 8);
        dVar1 = fabs(local_688);
        local_658 = (double)in_stack_fffffffffffff730 * dVar1 + local_658;
      }
      local_658 = sqrt(local_658);
      for (local_690 = 0; local_690 < local_48; local_690 = local_690 + 1) {
        TPZFMatrix<std::complex<double>_>::operator()
                  (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                   (int64_t)in_stack_fffffffffffff650);
        uVar6 = 0;
        std::complex<double>::complex(&local_6b0,local_658,0.0);
        std::operator/((complex<double> *)in_stack_fffffffffffff638,(complex<double> *)0x12b6696);
        local_6a0 = CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
        local_698 = uVar6;
        pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                           (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                            (int64_t)in_stack_fffffffffffff650);
        *(undefined8 *)pcVar3->_M_value = local_6a0;
        *(undefined8 *)(pcVar3->_M_value + 8) = local_698;
      }
      local_6c0 = 10.0;
      local_6c8 = 0.0;
      for (local_6b8 = 0; local_40 < local_6c0 && local_6b8 <= local_38; local_6b8 = local_6b8 + 1)
      {
        for (local_6d0 = 0; local_6d0 < local_48; local_6d0 = local_6d0 + 1) {
          pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                             (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                              (int64_t)in_stack_fffffffffffff650);
          pcVar4 = TPZFMatrix<std::complex<double>_>::operator()
                             (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                              (int64_t)in_stack_fffffffffffff650);
          *(undefined8 *)pcVar4->_M_value = *(undefined8 *)pcVar3->_M_value;
          *(undefined8 *)(pcVar4->_M_value + 8) = *(undefined8 *)(pcVar3->_M_value + 8);
        }
        Solve_LU(in_stack_fffffffffffff650,in_stack_fffffffffffff648);
        local_6d8 = 0.0;
        for (local_6e0 = 0; local_6e0 < local_48; local_6e0 = local_6e0 + 1) {
          in_stack_fffffffffffff6e0 =
               (TPZFMatrix<std::complex<double>_> *)
               TPZFMatrix<std::complex<double>_>::operator()
                         (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                          (int64_t)in_stack_fffffffffffff650);
          local_6f8 = (in_stack_fffffffffffff6e0->super_TPZMatrix<std::complex<double>_>).
                      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
          iStack_6f0 = (in_stack_fffffffffffff6e0->super_TPZMatrix<std::complex<double>_>).
                       super_TPZBaseMatrix.fRow;
          in_stack_fffffffffffff6d8 = (TPZMatrix<std::complex<double>_> *)fabs((double)local_6f8);
          pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                             (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                              (int64_t)in_stack_fffffffffffff650);
          local_708 = *(double *)pcVar3->_M_value;
          uStack_700 = *(undefined8 *)(pcVar3->_M_value + 8);
          dVar1 = fabs(local_708);
          local_6d8 = (double)in_stack_fffffffffffff6d8 * dVar1 + local_6d8;
        }
        local_6d8 = sqrt(local_6d8);
        local_6c8 = 0.0;
        for (local_710 = 0; local_710 < local_48; local_710 = local_710 + 1) {
          TPZFMatrix<std::complex<double>_>::operator()
                    (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                     (int64_t)in_stack_fffffffffffff650);
          uVar6 = 0;
          std::complex<double>::complex(&local_730,local_6d8,0.0);
          std::operator/((complex<double> *)in_stack_fffffffffffff638,(complex<double> *)0x12b6a06);
          local_720 = CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
          uStack_718 = uVar6;
          pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                             (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                              (int64_t)in_stack_fffffffffffff650);
          *(undefined8 *)pcVar3->_M_value = local_720;
          *(undefined8 *)(pcVar3->_M_value + 8) = uStack_718;
          TPZFMatrix<std::complex<double>_>::operator()
                    (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                     (int64_t)in_stack_fffffffffffff650);
          TPZFMatrix<std::complex<double>_>::operator()
                    (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                     (int64_t)in_stack_fffffffffffff650);
          std::operator-((complex<double> *)in_stack_fffffffffffff638,(complex<double> *)0x12b6ab7);
          in_stack_fffffffffffff680 =
               (TPZFNMatrix<9,_std::complex<double>_> *)
               TPZFMatrix<std::complex<double>_>::operator()
                         (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                          (int64_t)in_stack_fffffffffffff650);
          in_stack_fffffffffffff678 =
               (TPZFMatrix<std::complex<double>_> *)
               TPZFMatrix<std::complex<double>_>::operator()
                         (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                          (int64_t)in_stack_fffffffffffff650);
          std::operator-((complex<double> *)in_stack_fffffffffffff638,(complex<double> *)0x12b6b32);
          in_stack_fffffffffffff658 = CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07);
          std::operator*((complex<double> *)in_stack_fffffffffffff638,(complex<double> *)0x12b6b73);
          in_stack_fffffffffffff660 =
               (TPZFMatrix<std::complex<double>_> *)
               CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08);
          in_stack_fffffffffffff650 =
               (TPZMatrix<std::complex<double>_> *)fabs((double)in_stack_fffffffffffff660);
          local_6c8 = (double)in_stack_fffffffffffff650 + local_6c8;
        }
        local_6c0 = sqrt(local_6c8);
      }
      for (local_780 = 0; local_780 < local_48; local_780 = local_780 + 1) {
        in_stack_fffffffffffff648 =
             (TPZFMatrix<std::complex<double>_> *)
             TPZFMatrix<std::complex<double>_>::operator()
                       (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                        (int64_t)in_stack_fffffffffffff650);
        local_798 = (in_stack_fffffffffffff648->super_TPZMatrix<std::complex<double>_>).
                    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
        pcStack_790 = (complex<double> *)
                      (in_stack_fffffffffffff648->super_TPZMatrix<std::complex<double>_>).
                      super_TPZBaseMatrix.fRow;
        dVar1 = fabs((double)local_798);
        if (dVar1 < 1e-05) {
          std::complex<double>::operator=((complex<double> *)&local_798,0.0);
        }
        in_stack_fffffffffffff638 =
             (TPZVec<std::complex<double>_> *)
             TPZFMatrix<std::complex<double>_>::operator()
                       (in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                        (int64_t)in_stack_fffffffffffff650);
        in_stack_fffffffffffff638->_vptr_TPZVec = local_798;
        in_stack_fffffffffffff638->fStore = pcStack_790;
      }
      TPZFNMatrix<9,_std::complex<double>_>::~TPZFNMatrix
                ((TPZFNMatrix<9,_std::complex<double>_> *)0x12b6d3c);
    }
    local_1 = 1;
    local_1ac = 1;
    TPZFNMatrix<3,_std::complex<double>_>::~TPZFNMatrix
              ((TPZFNMatrix<3,_std::complex<double>_> *)0x12b6d75);
    TPZFNMatrix<3,_std::complex<double>_>::~TPZFNMatrix
              ((TPZFNMatrix<3,_std::complex<double>_> *)0x12b6d82);
  }
  else {
    local_1 = 0;
    local_1ac = 1;
  }
  TPZFNMatrix<9,_std::complex<double>_>::~TPZFNMatrix
            ((TPZFNMatrix<9,_std::complex<double>_> *)0x12b6dad);
  return (bool)(local_1 & 1);
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}